

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PedestriansWalkingAnEight.cpp
# Opt level: O3

PolylineSegmentedPathwaySingleRadius * anon_unknown.dwarf_983a7::getTestPath(void)

{
  PolylineSegmentedPathwaySingleRadius *this;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if ((anonymous_namespace)::gTestPath == (PolylineSegmentedPathwaySingleRadius *)0x0) {
    local_d8._0_4_ = -12.67873;
    local_d8._4_4_ = 0.014429;
    local_d8._8_8_ = 0xc12729893f05f612;
    local_c8 = 0xc05c3fa33c749060;
    uStack_c0 = 0x3c5230bac0bc79ee;
    local_b8 = 0x3f70f6adc0857f0b;
    uStack_b0 = 0x3eb376923b58665e;
    local_a8 = 0xbb85985b40bab713;
    uStack_a0 = 0x41303b0b40d1ff7a;
    local_98 = 0x4122cd72bc362846;
    uStack_90 = 0xbc54e8fb417f64ef;
    local_88 = 0x41959544410d2da4;
    uStack_80 = 0x401aef28bc279fed;
    local_78 = 0xbba5f84d4180712a;
    uStack_70 = 0x4128b862c0649408;
    local_68 = 0xc11ed4553b3a732e;
    uStack_60 = 0x3bdff82340bc47a4;
    local_58 = 0x404b62b7c1083910;
    uStack_50 = 0xc01534013b8986fd;
    local_48 = 0x3a856e693ff8cbc0;
    uStack_40 = 0xbf865bc040325719;
    local_38 = 0x40b246cc3a638a7e;
    uStack_30 = 0x3bcfd8f1c0f2987e;
    local_28 = 0xc146940540c45f2f;
    uStack_20 = 0x40644b453c31dd5d;
    _gEndpoint0 = 0x3c6c679dc14adc14;
    _DAT_0017b330 = 0x3f05f612;
    _gEndpoint1 = 0x3c31dd5dc1469405;
    _DAT_0017b340 = 0x40644b45;
    this = (PolylineSegmentedPathwaySingleRadius *)operator_new(0x68);
    OpenSteer::PolylineSegmentedPathwaySingleRadius::PolylineSegmentedPathwaySingleRadius
              (this,0x10,(Vec3 *)local_d8,2.0,false);
    (anonymous_namespace)::gTestPath = this;
  }
  return (anonymous_namespace)::gTestPath;
}

Assistant:

PolylineSegmentedPathwaySingleRadius* getTestPath (void)
{
    if (gTestPath == NULL)
    {
        const float pathRadius = 2;
        
        const PolylineSegmentedPathwaySingleRadius::size_type pathPointCount = 16;
        // const float size = 30;
        const Vec3 pathPoints[pathPointCount] = {
            Vec3( -12.678730011f, 0.0144290002063f, 0.523285984993f ),
            Vec3( -10.447640419f, 0.0149269998074f, -3.44138407707f ),
            Vec3( -5.88988399506f, 0.0128290001303f, -4.1717581749f ),
            Vec3( 0.941263973713f, 0.00330199999735f, 0.350513994694f ),
            Vec3( 5.83484792709f, -0.00407700007781f, 6.56243610382f ),
            Vec3( 11.0144147873f, -0.0111180003732f, 10.175157547f ),
            Vec3( 15.9621419907f, -0.0129949999973f, 8.82364273071f ),
            Vec3( 18.697883606f, -0.0102310003713f, 2.42084693909f ),
            Vec3( 16.0552558899f, -0.00506500015035f, -3.57153511047f ),
            Vec3( 10.5450153351f, 0.00284500000998f, -9.92683887482f ),
            Vec3( 5.88374519348f, 0.00683500012383f, -8.51393127441f ),
            Vec3( 3.17790007591f, 0.00419700006023f, -2.33129906654f ),
            Vec3( 1.94371795654f, 0.00101799995173f, 2.78656601906f ),
            Vec3( -1.04967498779f, 0.000867999973707f, 5.57114219666f ),
            Vec3( -7.58111476898f, 0.00634300010279f, 6.13661909103f ),
            Vec3( -12.4111375809f, 0.0108559997752f, 3.5670940876f )
        };
        
        

        
        // ------------------------------------ xxxcwr11-1-04 fixing steerToAvoid
        
        gEndpoint0 = pathPoints[0];
        gEndpoint1 = pathPoints[pathPointCount-1];
        
        gTestPath = new PolylineSegmentedPathwaySingleRadius (pathPointCount,
                                                              pathPoints,
                                                              pathRadius,
                                                              false);
    }
    return gTestPath;
}